

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_validation.c
# Opt level: O0

REF_STATUS ref_validation_boundary_manifold(REF_GRID ref_grid)

{
  REF_NODE ref_node_00;
  REF_CELL ref_cell_00;
  REF_STATUS RVar1;
  uint uVar2;
  uint uVar3;
  long lVar4;
  REF_STATUS ref_private_macro_code_rss;
  REF_LONG ref_private_status_reib_bi;
  REF_LONG ref_private_status_reib_ai;
  uint local_168;
  REF_STATUS ref_private_macro_code_rsb;
  REF_INT cell_list [10];
  int local_134;
  uint local_130;
  REF_INT ncell;
  REF_INT node1;
  REF_INT node0;
  REF_INT ns [27];
  uint local_ac;
  REF_INT c;
  REF_INT i;
  REF_INT nodes [27];
  int local_30;
  int local_2c;
  REF_INT cell_edge;
  REF_INT cell;
  REF_CELL ref_cell;
  REF_NODE ref_node;
  REF_GRID ref_grid_local;
  
  ref_node_00 = ref_grid->node;
  ref_cell_00 = ref_grid->cell[3];
  local_2c = 0;
  do {
    if (ref_cell_00->max <= local_2c) {
      return 0;
    }
    RVar1 = ref_cell_nodes(ref_cell_00,local_2c,&c);
    if (RVar1 == 0) {
      for (local_30 = 0; local_30 < ref_cell_00->edge_per; local_30 = local_30 + 1) {
        ncell = ref_cell_00->c2n[ref_cell_00->e2n[local_30 << 1] + ref_cell_00->size_per * local_2c]
        ;
        local_130 = ref_cell_00->c2n
                    [ref_cell_00->e2n[local_30 * 2 + 1] + ref_cell_00->size_per * local_2c];
        if ((ref_node_00->ref_mpi->id == ref_node_00->part[ncell]) ||
           (ref_node_00->ref_mpi->id == ref_node_00->part[(int)local_130])) {
          uVar2 = ref_cell_list_with2(ref_cell_00,ncell,local_130,10,&local_134,
                                      (REF_INT *)&local_168);
          if (uVar2 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_validation.c"
                   ,0x97,"ref_validation_boundary_manifold",(ulong)uVar2,
                   "more than ten triangles found with two nodes");
            printf("nodes %d %d faceid %d\n",(ulong)(uint)ncell,(ulong)local_130,
                   (ulong)(uint)nodes[1]);
            ref_node_location(ref_node_00,ncell);
            ref_node_location(ref_node_00,local_130);
            return uVar2;
          }
          lVar4 = (long)local_134;
          if (lVar4 != 2) {
            printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_validation.c"
                   ,0xa2,"ref_validation_boundary_manifold","two triangles expected",2,lVar4);
            printf("nodes %d %d faceid %d\n",(ulong)(uint)ncell,(ulong)local_130,
                   (ulong)(uint)nodes[1]);
            ref_node_location(ref_node_00,ncell);
            ref_node_location(ref_node_00,local_130);
            local_ac = 0;
            while( true ) {
              if (local_134 <= (int)local_ac) {
                return 1;
              }
              uVar2 = (&local_168)[(int)local_ac];
              uVar3 = ref_cell_nodes(ref_cell_00,uVar2,&node1);
              if (uVar3 != 0) break;
              lVar4 = CONCAT44((int)((ulong)lVar4 >> 0x20),ns[1]);
              printf(" item %d cell %d nodes %d %d %d id %d\n",(ulong)local_ac,(ulong)uVar2,
                     (ulong)(uint)node1,(ulong)(uint)node0,(ulong)(uint)ns[0],lVar4);
              local_ac = local_ac + 1;
            }
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_validation.c"
                   ,0x9e,"ref_validation_boundary_manifold",(ulong)uVar3,"get cell",lVar4);
            return uVar3;
          }
        }
      }
    }
    local_2c = local_2c + 1;
  } while( true );
}

Assistant:

REF_FCN REF_STATUS ref_validation_boundary_manifold(REF_GRID ref_grid) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell = ref_grid_tri(ref_grid);
  REF_INT cell, cell_edge, nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT i, c, ns[REF_CELL_MAX_SIZE_PER];
  REF_INT node0, node1, ncell, cell_list[10];

  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    each_ref_cell_cell_edge(ref_cell, cell_edge) {
      node0 = ref_cell_e2n(ref_cell, 0, cell_edge, cell);
      node1 = ref_cell_e2n(ref_cell, 1, cell_edge, cell);
      if (!ref_node_owned(ref_node, node0) && !ref_node_owned(ref_node, node1))
        continue;
      RSB(ref_cell_list_with2(ref_cell, node0, node1, 10, &ncell, cell_list),
          "more than ten triangles found with two nodes", {
            printf("nodes %d %d faceid %d\n", node0, node1, nodes[3]);
            ref_node_location(ref_node, node0);
            ref_node_location(ref_node, node1);
          });
      REIB(2, ncell, "two triangles expected", {
        printf("nodes %d %d faceid %d\n", node0, node1, nodes[3]);
        ref_node_location(ref_node, node0);
        ref_node_location(ref_node, node1);
        for (i = 0; i < ncell; i++) {
          c = cell_list[i];
          RSS(ref_cell_nodes(ref_cell, c, ns), "get cell");
          printf(" item %d cell %d nodes %d %d %d id %d\n", i, c, ns[0], ns[1],
                 ns[2], ns[3]);
        }
      });
    }
  }

  return REF_SUCCESS;
}